

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,Arena *arena)

{
  undefined4 uVar1;
  ulong uVar2;
  uint uVar3;
  TcParseTableBase *table_00;
  bool bVar4;
  char cVar5;
  uint32_t size;
  string *psVar6;
  byte bVar7;
  uint uVar8;
  size_type sVar9;
  uint uVar10;
  pointer pcVar11;
  ulong uVar12;
  undefined8 uVar13;
  byte bVar14;
  ulong uVar15;
  pointer pcVar16;
  string *s;
  string_view sVar17;
  string_view sVar18;
  string_view message_name;
  string_view field_name;
  undefined1 in_stack_ffffffffffffff78;
  MapTypeCard local_82;
  uchar local_81;
  char *ptr_local;
  uint32_t inner_tag;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  char *local_60;
  TcParseTableBase *local_58;
  FieldEntry *local_50;
  NodeBase *local_48;
  uint32_t local_40 [4];
  
  uVar2 = *(ulong *)&aux->enum_range;
  uVar3 = (uint)(uVar2 >> 8);
  local_74 = (uint)(uVar2 >> 0x10) & 0xffff;
  local_64 = (uint)uVar2 & 0xff;
  bVar14 = (byte)uVar2 & 7 | 8;
  local_6c = (uint)bVar14;
  local_70 = uVar3 & 0xffff07 | 0x10;
  local_68 = uVar3 & 7 | 0x10;
  ptr_local = ptr;
  local_58 = table;
  local_50 = entry;
  local_48 = node;
  do {
    while( true ) {
      bVar4 = ParseContext::Done(ctx,&ptr_local);
      if (bVar4) {
        return ptr_local;
      }
      bVar7 = *ptr_local;
      inner_tag = (uint32_t)(char)bVar7;
      if ((bVar14 == bVar7) || ((byte)local_70 == bVar7)) break;
      ptr_local = ReadTag(ptr_local,&inner_tag,0);
      if ((inner_tag == local_6c) || (inner_tag == local_68)) goto LAB_0014c8c3;
      if (ptr_local == (char *)0x0) {
        return (char *)0x0;
      }
      if ((inner_tag == 0) || ((inner_tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = inner_tag - 1;
        return ptr_local;
      }
      ptr_local = UnknownFieldParse(inner_tag,(string *)0x0,ptr_local,ctx);
LAB_0014ca8d:
      if (ptr_local == (char *)0x0) {
        return (char *)0x0;
      }
    }
    ptr_local = ptr_local + 1;
LAB_0014c8c3:
    uVar8 = uVar3 & 0xff;
    if (inner_tag == local_6c) {
      uVar8 = local_64;
    }
    uVar12 = uVar2 >> 0x20 & 0xffff;
    if (inner_tag == local_6c) {
      uVar12 = 8;
    }
    local_82.data_ = (uint8_t)uVar8;
    if (5 < (local_82.data_ & 7)) {
switchD_0014c903_caseD_3:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0xa6b);
    }
    s = (string *)((long)&local_48->next + uVar12);
    switch(uVar8 & 7) {
    case 0:
      pcVar16 = (pointer)(long)*ptr_local;
      if ((long)pcVar16 < 0) {
        uVar12 = (long)ptr_local[1] << 7 | 0x7f;
        if ((long)uVar12 < 0) {
          uVar15 = (long)ptr_local[2] << 0xe | 0x3fff;
          if ((long)uVar15 < 0) {
            uVar12 = uVar12 & ((long)ptr_local[3] << 0x15 | 0x1fffffU);
            if ((long)uVar12 < 0) {
              uVar15 = uVar15 & ((long)ptr_local[4] << 0x1c | 0xfffffffU);
              if ((long)uVar15 < 0) {
                uVar12 = uVar12 & ((long)ptr_local[5] << 0x23 | 0x7ffffffffU);
                if ((long)uVar12 < 0) {
                  uVar15 = uVar15 & ((long)ptr_local[6] << 0x2a | 0x3ffffffffffU);
                  if ((long)uVar15 < 0) {
                    uVar12 = uVar12 & ((long)ptr_local[7] << 0x31 | 0x1ffffffffffffU);
                    if ((long)uVar12 < 0) {
                      uVar15 = uVar15 & ((ulong)(byte)ptr_local[8] << 0x38 | 0xffffffffffffff);
                      if ((long)uVar15 < 0) {
                        bVar7 = ptr_local[9];
                        ptr_local = ptr_local + 10;
                        if (bVar7 != 1) {
                          if ((char)bVar7 < '\0') {
                            return (char *)0x0;
                          }
                          if ((bVar7 & 1) == 0) {
                            uVar15 = uVar15 ^ 0x8000000000000000;
                          }
                        }
                      }
                      else {
                        ptr_local = ptr_local + 9;
                      }
                    }
                    else {
                      ptr_local = ptr_local + 8;
                    }
                  }
                  else {
                    ptr_local = ptr_local + 7;
                  }
                }
                else {
                  ptr_local = ptr_local + 6;
                }
              }
              else {
                ptr_local = ptr_local + 5;
              }
            }
            else {
              ptr_local = ptr_local + 4;
            }
          }
          else {
            ptr_local = ptr_local + 3;
          }
          uVar12 = uVar12 & uVar15;
        }
        else {
          ptr_local = ptr_local + 2;
        }
        pcVar16 = (pointer)((ulong)pcVar16 & uVar12);
      }
      else {
        ptr_local = ptr_local + 1;
      }
      bVar7 = local_82.data_ >> 3 & 7;
      uVar8 = (uint)pcVar16;
      if (bVar7 == 2) {
        bVar4 = MapTypeCard::is_zigzag(&local_82);
        pcVar11 = (pointer)(-(ulong)(uVar8 & 1) ^ (ulong)pcVar16 >> 1);
        if (!bVar4) {
          pcVar11 = pcVar16;
        }
        (s->_M_dataplus)._M_p = pcVar11;
      }
      else if (bVar7 == 1) {
        bVar4 = MapTypeCard::is_zigzag(&local_82);
        uVar10 = -(uVar8 & 1) ^ (uint)((ulong)pcVar16 >> 1) & 0x7fffffff;
        if (!bVar4) {
          uVar10 = uVar8;
        }
        *(uint *)&(s->_M_dataplus)._M_p = uVar10;
      }
      else {
        if (bVar7 != 0) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xa47);
        }
        *(bool *)&(s->_M_dataplus)._M_p = pcVar16 != (pointer)0x0;
      }
      break;
    case 1:
      pcVar16 = *(pointer *)ptr_local;
      ptr_local = ptr_local + 8;
      (s->_M_dataplus)._M_p = pcVar16;
      break;
    case 2:
      bVar7 = local_82.data_ >> 3 & 7;
      if (bVar7 != 3) {
        psVar6 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           ((uint)bVar7,4,"+type_card.cpp_type() == +MapTypeCard::kMessage");
        if (psVar6 != (string *)0x0) {
          pcVar16 = (psVar6->_M_dataplus)._M_p;
          sVar9 = psVar6->_M_string_length;
          uVar13 = 0xa64;
LAB_0014cc86:
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,uVar13,sVar9,pcVar16);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_40);
        }
        local_40[0] = inner_tag;
        local_81 = (uchar)local_70;
        psVar6 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_char>
                           (local_40,&local_81,"inner_tag == value_tag");
        if (psVar6 != (string *)0x0) {
          pcVar16 = (psVar6->_M_dataplus)._M_p;
          sVar9 = psVar6->_M_string_length;
          uVar13 = 0xa65;
          goto LAB_0014cc86;
        }
        ptr_local = ParseContext::ParseMessage(ctx,(MessageLite *)s,ptr_local);
        goto LAB_0014ca8d;
      }
      size = ReadSize(&ptr_local);
      if (ptr_local == (char *)0x0) {
        return (char *)0x0;
      }
      ptr_local = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,ptr_local,size,s);
      if (ptr_local == (char *)0x0) {
        return (char *)0x0;
      }
      uVar8 = local_74 & 0xc;
      bVar4 = MapTypeCard::is_utf8(&local_82);
      if ((bVar4 && uVar8 != 0) &&
         (cVar5 = utf8_range::IsStructurallyValid(s->_M_string_length,(s->_M_dataplus)._M_p),
         table_00 = local_58, cVar5 == '\0')) {
        sVar17 = MessageName(local_58);
        local_60 = sVar17._M_str;
        sVar18 = FieldName(table_00,local_50);
        message_name._M_str = (char *)sVar18._M_len;
        message_name._M_len = (size_t)local_60;
        field_name._M_str = "parsing";
        field_name._M_len = (size_t)sVar18._M_str;
        PrintUTF8ErrorLog((internal *)sVar17._M_len,message_name,field_name,(char *)0x0,
                          (bool)in_stack_ffffffffffffff78);
        if ((local_74 & 4) != 0) {
          return (char *)0x0;
        }
      }
      break;
    default:
      goto switchD_0014c903_caseD_3;
    case 5:
      uVar1 = *(undefined4 *)ptr_local;
      ptr_local = ptr_local + 4;
      *(undefined4 *)&(s->_M_dataplus)._M_p = uVar1;
    }
  } while( true );
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, Arena* arena) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = WFL::MakeTag(1, map_info.key_type_card.wiretype());
  const uint8_t value_tag =
      WFL::MakeTag(2, map_info.value_type_card.wiretype());

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                               inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                                 inner_tag != value_tag)) {
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      obj = node->GetVoidValue(map_info.node_size_info);
    }

    switch (type_card.wiretype()) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_card.cpp_type()) {
          case MapTypeCard::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case MapTypeCard::k32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case MapTypeCard::k64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_card.cpp_type() == MapTypeCard::kString) {
          const int size = ReadSize(&ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(+type_card.cpp_type(), +MapTypeCard::kMessage);
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseMessage(reinterpret_cast<MessageLite*>(obj), ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}